

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpSolver.cc
# Opt level: O0

bool __thiscall Glucose::SimpSolver::merge(SimpSolver *this,Clause *_ps,Clause *_qs,Var v,int *size)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  Lit p;
  Lit *pLVar4;
  Lit *pLVar5;
  int in_ECX;
  Clause *in_RDX;
  Clause *in_RSI;
  long in_RDI;
  int *in_R8;
  int j;
  int i;
  Lit *__qs;
  Lit *__ps;
  Clause *qs;
  Clause *ps;
  bool ps_smallest;
  Clause *local_88;
  int local_64;
  int local_5c;
  
  *(int *)(in_RDI + 0x4c4) = *(int *)(in_RDI + 0x4c4) + 1;
  iVar2 = Clause::size(in_RSI);
  iVar3 = Clause::size(in_RDX);
  local_88 = in_RDX;
  if (iVar2 < iVar3) {
    local_88 = in_RSI;
    in_RSI = in_RDX;
  }
  pLVar4 = Clause::operator_cast_to_Lit_(in_RSI);
  pLVar5 = Clause::operator_cast_to_Lit_(local_88);
  iVar2 = Clause::size(in_RSI);
  *in_R8 = iVar2 + -1;
  local_5c = 0;
  do {
    iVar2 = Clause::size(local_88);
    if (iVar2 <= local_5c) {
      return true;
    }
    iVar2 = var((Lit)pLVar5[local_5c].x);
    if (iVar2 != in_ECX) {
      for (local_64 = 0; iVar2 = Clause::size(in_RSI), local_64 < iVar2; local_64 = local_64 + 1) {
        iVar2 = var((Lit)pLVar4[local_64].x);
        iVar3 = var((Lit)pLVar5[local_5c].x);
        if (iVar2 == iVar3) {
          p = operator~(pLVar5[local_5c].x);
          bVar1 = Lit::operator==(pLVar4 + local_64,p);
          if (bVar1) {
            return false;
          }
          goto LAB_00124bde;
        }
      }
      *in_R8 = *in_R8 + 1;
    }
LAB_00124bde:
    local_5c = local_5c + 1;
  } while( true );
}

Assistant:

bool SimpSolver::merge(const Clause& _ps, const Clause& _qs, Var v, int& size)
{
    merges++;

    bool  ps_smallest = _ps.size() < _qs.size();
    const Clause& ps  =  ps_smallest ? _qs : _ps;
    const Clause& qs  =  ps_smallest ? _ps : _qs;
    const Lit*  __ps  = (const Lit*)ps;
    const Lit*  __qs  = (const Lit*)qs;

    size = ps.size()-1;

    for (int i = 0; i < qs.size(); i++){
        if (var(__qs[i]) != v){
            for (int j = 0; j < ps.size(); j++)
                if (var(__ps[j]) == var(__qs[i]))
                    if (__ps[j] == ~__qs[i])
                        return false;
                    else
                        goto next;
            size++;
        }
        next:;
    }

    return true;
}